

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3Fts3NextToken(char *zStr,int *pn)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  char *z1;
  byte *pbVar4;
  byte bVar5;
  
  pbVar2 = (byte *)(zStr + 1);
  do {
    bVar1 = pbVar2[-1];
    pbVar4 = pbVar2;
    if (bVar1 < 0x27) {
      if (bVar1 == 0) {
        return (char *)0x0;
      }
      if (bVar1 == 0x22) goto LAB_001bccdc;
    }
    else {
      if ((bVar1 == 0x27) || (bVar1 == 0x60)) {
LAB_001bccdc:
        bVar5 = *pbVar2;
        if (bVar5 == 0) goto LAB_001bcd40;
        pbVar3 = pbVar2 + -1;
        break;
      }
      pbVar3 = pbVar2;
      if (bVar1 == 0x5b) goto LAB_001bcd27;
    }
    if (((char)bVar1 < '\0') || (sqlite3Fts3IsIdChar_isFtsIdChar[bVar1] != '\0')) goto LAB_001bcd10;
    pbVar2 = pbVar2 + 1;
    zStr = (char *)(ulong)((int)zStr + 1);
  } while( true );
  while( true ) {
    pbVar3 = pbVar4;
    pbVar4 = pbVar3 + 1;
    bVar5 = pbVar3[1];
    if (bVar5 == 0) break;
    if ((bVar5 == bVar1) && (pbVar4 = pbVar3 + 2, pbVar3[2] != bVar1)) break;
  }
  goto LAB_001bcd40;
LAB_001bcd10:
  while (((long)(char)*pbVar4 < 0 || (sqlite3Fts3IsIdChar_isFtsIdChar[(char)*pbVar4] != '\0'))) {
    pbVar4 = pbVar4 + 1;
  }
  goto LAB_001bcd40;
  while (pbVar3 = pbVar4 + 1, bVar1 != 0) {
LAB_001bcd27:
    pbVar4 = pbVar3;
    bVar1 = *pbVar4;
    if (bVar1 == 0x5d) break;
  }
  if (bVar1 != 0) {
    pbVar4 = pbVar4 + 1;
  }
LAB_001bcd40:
  *pn = (int)pbVar4 - (int)zStr;
  return (char *)(pbVar2 + -1);
}

Assistant:

SQLITE_PRIVATE const char *sqlite3Fts3NextToken(const char *zStr, int *pn){
  const char *z1;
  const char *z2 = 0;

  /* Find the start of the next token. */
  z1 = zStr;
  while( z2==0 ){
    char c = *z1;
    switch( c ){
      case '\0': return 0;        /* No more tokens here */
      case '\'':
      case '"':
      case '`': {
        z2 = z1;
        while( *++z2 && (*z2!=c || *++z2==c) );
        break;
      }
      case '[':
        z2 = &z1[1];
        while( *z2 && z2[0]!=']' ) z2++;
        if( *z2 ) z2++;
        break;

      default:
        if( sqlite3Fts3IsIdChar(*z1) ){
          z2 = &z1[1];
          while( sqlite3Fts3IsIdChar(*z2) ) z2++;
        }else{
          z1++;
        }
    }
  }

  *pn = (int)(z2-z1);
  return z1;
}